

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

exr_result_t
exr_start_temporary_context
          (exr_context_t *ctxt,char *context_name,exr_context_initializer_t *ctxtdata)

{
  undefined8 *in_RDI;
  exr_context_initializer_t inits;
  exr_context_t ret;
  exr_result_t rv;
  exr_context_initializer_t *in_stack_ffffffffffffff50;
  exr_context_t *pctxt;
  exr_context_t in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff80;
  _INTERNAL_EXR_CONTEXT_MODE in_stack_ffffffffffffff8c;
  exr_context_initializer_t *in_stack_ffffffffffffff90;
  exr_context_t *in_stack_ffffffffffffff98;
  exr_result_t local_24;
  exr_result_t local_4;
  
  fill_context_data(in_stack_ffffffffffffff50);
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = 3;
  }
  else {
    local_24 = internal_exr_alloc_context
                         (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                          in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80);
    if (local_24 == 0) {
      pctxt = (exr_context_t *)0x0;
      local_24 = exr_attr_string_create
                           (in_stack_ffffffffffffff68,(exr_attr_string_t *)0x8,(char *)0x0);
      if (local_24 != 0) {
        exr_finish(pctxt);
      }
    }
    *in_RDI = 0;
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

exr_result_t exr_start_temporary_context (
    exr_context_t*                   ctxt,
    const char*                      context_name,
    const exr_context_initializer_t* ctxtdata)
{
    exr_result_t              rv    = EXR_ERR_UNKNOWN;
    exr_context_t             ret   = NULL;
    exr_context_initializer_t inits = fill_context_data (ctxtdata);

    if (!ctxt) return EXR_ERR_INVALID_ARGUMENT;

    rv = internal_exr_alloc_context (
        &ret,
        &inits,
        EXR_CONTEXT_TEMPORARY,
        0);

    if (rv == EXR_ERR_SUCCESS)
    {
        rv = exr_attr_string_create (
            (exr_context_t) ret, &(ret->filename), context_name ? context_name : "<temporary>");
        if (rv != EXR_ERR_SUCCESS) exr_finish ((exr_context_t*) &ret);
    }

    *ctxt = (exr_context_t) ret;
    return rv;
}